

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::InvalidOperationTest::Run(InvalidOperationTest *this)

{
  GLuint GVar1;
  char *pcVar2;
  char *pcVar3;
  GLenum local_12c;
  GLchar local_128 [4];
  GLenum props [1];
  GLchar name [100];
  GLsizei local_bc;
  GLint local_b8;
  GLsizei len;
  GLint res;
  GLuint sh;
  string local_90 [32];
  GLuint local_70;
  GLuint program2;
  string local_60 [32];
  string local_40 [36];
  GLuint local_1c;
  long lStack_18;
  GLuint program;
  long error;
  InvalidOperationTest *this_local;
  
  lStack_18 = 0;
  error = (long)this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_60);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,pcVar2,pcVar3,false);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  local_1c = GVar1;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(&res);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,pcVar2,pcVar3,false);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string(local_90);
  local_70 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_1c);
  len = glu::CallLogWrapper::glCreateShader
                  (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8b30);
  memset(local_128,0,100);
  local_12c = 0x92fc;
  anon_unknown_0::Output("Case 1: <program> is the name of a shader object\n");
  glu::CallLogWrapper::glGetProgramInterfaceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len,0x92e3,0x92f5,&local_b8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glGetProgramResourceIndex
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len,0x92e3,0,0x400,&local_bc,local_128);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len,0x92e3,0,1,&local_12c,0x400,&local_bc,&local_b8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glGetProgramResourceLocation
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glGetProgramResourceLocationIndex
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len,0x92e4,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,len);
  anon_unknown_0::Output("Case 1 finished\n");
  anon_unknown_0::Output("Case 2: <pname> is not supported in GetProgramInterfaceiv\n");
  glu::CallLogWrapper::glGetProgramInterfaceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,0x92e3,0x92f7,&local_b8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  anon_unknown_0::Output("Case 2 finished\n");
  anon_unknown_0::Output("Case 3: <props> is not supported in GetProgramResourceiv");
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,0x92e3,0,1,&local_12c,0x400,&local_bc,&local_b8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  anon_unknown_0::Output("Case 3 finished\n");
  anon_unknown_0::Output
            (
            "Case 4: <program> has not been linked in GetProgramResourceLocation/GetProgramResourceLocationIndex\n"
            );
  glu::CallLogWrapper::glGetProgramResourceLocation
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_70,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glGetProgramResourceLocationIndex
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_70,0x92e4,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&stack0xffffffffffffffe8);
  anon_unknown_0::Output("Case 4 finished\n");
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_70);
  return lStack_18;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		GLuint program  = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		GLuint program2 = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
		GLint		 res;
		GLsizei		 len;
		GLchar		 name[100] = { '\0' };
		GLenum		 props[1]  = { GL_OFFSET };

		Output("Case 1: <program> is the name of a shader object\n");
		glGetProgramInterfaceiv(sh, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceIndex(sh, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceName(sh, GL_PROGRAM_INPUT, 0, 1024, &len, name);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceiv(sh, GL_PROGRAM_INPUT, 0, 1, props, 1024, &len, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceLocation(sh, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceLocationIndex(sh, GL_PROGRAM_OUTPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glDeleteShader(sh);
		Output("Case 1 finished\n");

		Output("Case 2: <pname> is not supported in GetProgramInterfaceiv\n");
		glGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NUM_ACTIVE_VARIABLES, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		Output("Case 2 finished\n");

		Output("Case 3: <props> is not supported in GetProgramResourceiv");
		glGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 1, props, 1024, &len, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		Output("Case 3 finished\n");

		Output("Case 4: <program> has not been linked in GetProgramResourceLocation/GetProgramResourceLocationIndex\n");
		glGetProgramResourceLocation(program2, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceLocationIndex(program2, GL_PROGRAM_OUTPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		Output("Case 4 finished\n");

		glDeleteProgram(program);
		glDeleteProgram(program2);
		return error;
	}